

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpke_test.cc
# Opt level: O2

void __thiscall
bssl::HPKETest_SetupSenderWrongLengthPeerPublicValue_Test::TestBody
          (HPKETest_SetupSenderWrongLengthPeerPublicValue_Test *this)

{
  int iVar1;
  EVP_HPKE_KEM *kem;
  EVP_HPKE_KDF *kdf;
  EVP_HPKE_AEAD *aead;
  ulong uVar2;
  AssertHelper local_368;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_360;
  AssertionResult gtest_ar_;
  string local_348;
  uint8_t bogus_public_key_r [37];
  size_t enc_len;
  uint8_t enc [32];
  ScopedEVP_HPKE_CTX sender_ctx;
  
  bogus_public_key_r[8] = '\0';
  bogus_public_key_r[9] = '\0';
  bogus_public_key_r[10] = '\0';
  bogus_public_key_r[0xb] = '\0';
  bogus_public_key_r[0xc] = '\0';
  bogus_public_key_r[0xd] = '\0';
  bogus_public_key_r[0xe] = '\0';
  bogus_public_key_r[0xf] = '\0';
  bogus_public_key_r[0x10] = '\0';
  bogus_public_key_r[0x11] = '\0';
  bogus_public_key_r[0x12] = '\0';
  bogus_public_key_r[0x13] = '\0';
  bogus_public_key_r[0x14] = '\0';
  bogus_public_key_r[0x15] = '\0';
  bogus_public_key_r[0x16] = '\0';
  bogus_public_key_r[0x17] = '\0';
  bogus_public_key_r[0x18] = '\0';
  bogus_public_key_r[0x19] = '\0';
  bogus_public_key_r[0x1a] = '\0';
  bogus_public_key_r[0x1b] = '\0';
  bogus_public_key_r[0x1c] = '\0';
  bogus_public_key_r[0x1d] = '\0';
  bogus_public_key_r[0x1e] = '\0';
  bogus_public_key_r[0x1f] = '\0';
  bogus_public_key_r[0x20] = '\0';
  bogus_public_key_r[0x21] = '\0';
  bogus_public_key_r[0x22] = '\0';
  bogus_public_key_r[0x23] = '\0';
  bogus_public_key_r[0x24] = '\0';
  bogus_public_key_r[0] = 0xff;
  bogus_public_key_r[1] = '\0';
  bogus_public_key_r[2] = '\0';
  bogus_public_key_r[3] = '\0';
  bogus_public_key_r[4] = '\0';
  bogus_public_key_r[5] = '\0';
  bogus_public_key_r[6] = '\0';
  bogus_public_key_r[7] = '\0';
  EVP_HPKE_CTX_zero(&sender_ctx.ctx_);
  kem = EVP_hpke_x25519_hkdf_sha256();
  kdf = EVP_hpke_hkdf_sha256();
  aead = EVP_hpke_aes_128_gcm();
  iVar1 = EVP_HPKE_CTX_setup_sender
                    (&sender_ctx.ctx_,enc,&enc_len,0x20,kem,kdf,aead,bogus_public_key_r,0x25,
                     (uint8_t *)0x0,0);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ = iVar1 == 0;
  if (gtest_ar_.success_) {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    uVar2 = ERR_get_error();
    ErrorEquals((uint32_t)&gtest_ar_,(int)uVar2,6);
    if (gtest_ar_.success_ == false) {
      testing::Message::Message((Message *)&local_360);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_348,(internal *)&gtest_ar_,
                 (AssertionResult *)"ErrorEquals(ERR_get_error(), ERR_LIB_EVP, 134)","false","true",
                 (char *)kdf);
      testing::internal::AssertHelper::AssertHelper
                (&local_368,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke_test.cc"
                 ,0x27a,local_348._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_368,(Message *)&local_360);
      testing::internal::AssertHelper::~AssertHelper(&local_368);
      std::__cxx11::string::~string((string *)&local_348);
      if (local_360._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_360._M_head_impl + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    ERR_clear_error();
  }
  else {
    testing::Message::Message((Message *)&local_360);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_348,(internal *)&gtest_ar_,
               (AssertionResult *)
               "EVP_HPKE_CTX_setup_sender( sender_ctx.get(), enc, &enc_len, sizeof(enc), EVP_hpke_x25519_hkdf_sha256(), EVP_hpke_hkdf_sha256(), EVP_hpke_aes_128_gcm(), bogus_public_key_r, sizeof(bogus_public_key_r), nullptr, 0)"
               ,"true","false",(char *)kdf);
    testing::internal::AssertHelper::AssertHelper
              (&local_368,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke_test.cc"
               ,0x278,local_348._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_368,(Message *)&local_360);
    testing::internal::AssertHelper::~AssertHelper(&local_368);
    std::__cxx11::string::~string((string *)&local_348);
    if (local_360._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_360._M_head_impl + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
  }
  internal::StackAllocated<evp_hpke_ctx_st,_void,_&EVP_HPKE_CTX_zero,_&EVP_HPKE_CTX_cleanup>::
  ~StackAllocated(&sender_ctx);
  return;
}

Assistant:

TEST(HPKETest, SetupSenderWrongLengthPeerPublicValue) {
  const uint8_t bogus_public_key_r[X25519_PRIVATE_KEY_LEN + 5] = {0xff};
  ScopedEVP_HPKE_CTX sender_ctx;
  uint8_t enc[X25519_PUBLIC_VALUE_LEN];
  size_t enc_len;
  ASSERT_FALSE(EVP_HPKE_CTX_setup_sender(
      sender_ctx.get(), enc, &enc_len, sizeof(enc),
      EVP_hpke_x25519_hkdf_sha256(), EVP_hpke_hkdf_sha256(),
      EVP_hpke_aes_128_gcm(), bogus_public_key_r, sizeof(bogus_public_key_r),
      nullptr, 0));
  EXPECT_TRUE(
      ErrorEquals(ERR_get_error(), ERR_LIB_EVP, EVP_R_INVALID_PEER_KEY));
  ERR_clear_error();
}